

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctfst.c
# Opt level: O2

void jpeg_fdct_ifast(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  uVar4 = (ulong)start_col;
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
    lVar3 = *(long *)((long)sample_data + lVar5);
    bVar1 = *(byte *)(lVar3 + 7 + uVar4);
    iVar13 = (uint)bVar1 + (uint)*(byte *)(lVar3 + uVar4);
    iVar6 = (uint)*(byte *)(lVar3 + uVar4) - (uint)bVar1;
    bVar1 = *(byte *)(lVar3 + 1 + uVar4);
    bVar2 = *(byte *)(lVar3 + 6 + uVar4);
    iVar7 = (uint)bVar2 + (uint)bVar1;
    iVar11 = (uint)bVar1 - (uint)bVar2;
    bVar1 = *(byte *)(lVar3 + 2 + uVar4);
    bVar2 = *(byte *)(lVar3 + 5 + uVar4);
    iVar15 = (uint)bVar2 + (uint)bVar1;
    iVar12 = (uint)bVar1 - (uint)bVar2;
    bVar1 = *(byte *)(lVar3 + 3 + uVar4);
    bVar2 = *(byte *)(lVar3 + 4 + uVar4);
    iVar14 = (uint)bVar2 + (uint)bVar1;
    iVar8 = iVar14 + iVar13;
    iVar13 = iVar13 - iVar14;
    iVar14 = iVar15 + iVar7;
    data[lVar5] = iVar8 + iVar14 + -0x400;
    data[lVar5 + 4] = iVar8 - iVar14;
    iVar8 = ((iVar7 - iVar15) + iVar13) * 0xb5 >> 8;
    data[lVar5 + 2] = iVar8 + iVar13;
    data[lVar5 + 6] = iVar13 - iVar8;
    iVar7 = ((uint)bVar1 - (uint)bVar2) + iVar12;
    iVar8 = iVar11 + iVar6;
    iVar14 = (iVar7 - iVar8) * 0x62 >> 8;
    iVar13 = (iVar7 * 0x8b >> 8) + iVar14;
    iVar14 = (iVar8 * 0x14e >> 8) + iVar14;
    iVar7 = (iVar12 + iVar11) * 0xb5 >> 8;
    iVar8 = iVar7 + iVar6;
    iVar6 = iVar6 - iVar7;
    data[lVar5 + 5] = iVar13 + iVar6;
    data[lVar5 + 3] = iVar6 - iVar13;
    data[lVar5 + 1] = iVar14 + iVar8;
    data[lVar5 + 7] = iVar8 - iVar14;
  }
  for (iVar8 = 7; -1 < iVar8; iVar8 = iVar8 + -1) {
    iVar14 = data[0x38] + *data;
    iVar13 = *data - data[0x38];
    iVar6 = data[0x30] + data[8];
    iVar15 = data[8] - data[0x30];
    iVar7 = data[0x28] + data[0x10];
    iVar10 = data[0x10] - data[0x28];
    iVar12 = data[0x20];
    iVar11 = iVar12 + data[0x18];
    iVar9 = iVar11 + iVar14;
    iVar14 = iVar14 - iVar11;
    iVar11 = iVar7 + iVar6;
    *data = iVar9 + iVar11;
    data[0x20] = iVar9 - iVar11;
    iVar6 = (int)((ulong)((long)((iVar6 - iVar7) + iVar14) * 0xb5) >> 8);
    data[0x10] = iVar14 + iVar6;
    data[0x30] = iVar14 - iVar6;
    iVar7 = (data[0x18] - iVar12) + iVar10;
    iVar14 = iVar15 + iVar13;
    iVar6 = (int)((ulong)((long)(iVar7 - iVar14) * 0x62) >> 8);
    iVar7 = (int)((ulong)((long)iVar7 * 0x8b) >> 8) + iVar6;
    iVar6 = (int)((ulong)((long)iVar14 * 0x14e) >> 8) + iVar6;
    iVar14 = (int)((ulong)((long)(iVar10 + iVar15) * 0xb5) >> 8);
    iVar11 = iVar13 + iVar14;
    iVar13 = iVar13 - iVar14;
    data[0x28] = iVar7 + iVar13;
    data[0x18] = iVar13 - iVar7;
    data[8] = iVar6 + iVar11;
    data[0x38] = iVar11 - iVar6;
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_ifast (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z1, z2, z3, z4, z5, z11, z13;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp7 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp6 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp5 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);
    tmp4 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}